

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-softmaxes.cc
# Opt level: O3

void __thiscall
dynet::LogSoftmax::backward_dev_impl<dynet::Device_CPU>
          (LogSoftmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint uVar2;
  Tensor *pTVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint local_174;
  type local_168;
  Device_CPU *local_148;
  StoragePointerType local_140;
  type local_138;
  uint local_80 [7];
  undefined4 local_64;
  uint local_60;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_3UL>,_const_Eigen::TensorReshapingOp<const_std::array<int,_3UL>,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
  local_40;
  
  pTVar3 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar5 = 1;
  if (1 < (pTVar3->d).nd) {
    uVar5 = (pTVar3->d).d[1];
  }
  uVar1 = (fx->d).bd;
  local_168.m_data = (StoragePointerType)(this->super_Node).aux_mem;
  local_64 = 1;
  uVar2 = (dEdf->d).nd;
  if (uVar2 == 2) {
    uVar6 = (dEdf->d).d[0];
    local_138.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)(dEdf->d).d[1];
  }
  else {
    uVar6 = 1;
    if (uVar2 != 0) {
      uVar6 = (dEdf->d).d[0];
    }
    local_138.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] = 1;
  }
  local_138.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] = (long)(int)(dEdf->d).bd;
  local_138.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)uVar6;
  local_138.m_lhs_xpr.m_data = dEdf->v;
  local_138.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_data =
       (StoragePointerType)
       ((ulong)local_138.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_data & 0xffffffff00000000);
  local_168.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)uVar5;
  local_168.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)uVar1;
  local_40.m_lhs_xpr = &local_168;
  local_40.m_rhs_xpr = &local_138;
  local_148 = dev;
  local_140 = local_168.m_data;
  local_80[0] = uVar5;
  local_60 = uVar1;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
  ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>
         *)&local_40,dev->edevice);
  iVar8 = 1;
  lVar7 = 0;
  do {
    iVar8 = iVar8 * local_80[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 1);
  uVar2 = (dEdf->d).nd;
  if (uVar2 == 2) {
    local_174 = (dEdf->d).d[0];
    local_138.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
         (long)(int)(dEdf->d).d[1];
  }
  else {
    local_174 = 1;
    if (uVar2 != 0) {
      local_174 = (dEdf->d).d[0];
    }
    local_138.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] = 1;
  }
  local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[0] = (fx->d).d[0];
  uVar2 = (fx->d).nd;
  local_138.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
       (long)(int)(fx->d).bd;
  local_138.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_data = fx->v;
  local_138.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
       (long)(int)(dEdf->d).bd;
  local_138.m_rhs_xpr.m_rhs_xpr.m_data = dEdf->v;
  uVar6 = (dEdxi->d).nd;
  if (uVar6 == 2) {
    uVar9 = (dEdxi->d).d[0];
    local_168.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)(dEdxi->d).d[1];
  }
  else {
    uVar9 = 1;
    if (uVar6 != 0) {
      uVar9 = (dEdxi->d).d[0];
    }
    local_168.m_dimensions.super_array<long,_3>._M_elems[1] = 1;
  }
  local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_1>.
  _M_elems[0]._0_4_ = iVar8 * uVar1;
  local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_1>.
  _M_elems[0]._4_4_ = 0;
  uVar6 = local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[0];
  if (uVar2 == 0) {
    uVar6 = 1;
  }
  uVar4 = (fx->d).d[1];
  if (uVar2 != 2) {
    uVar4 = 1;
  }
  local_168.m_dimensions.super_array<long,_3>._M_elems[2] = (long)(int)(dEdxi->d).bd;
  local_168.m_data = dEdxi->v;
  local_168.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)uVar9;
  if (uVar2 == 2) {
    uVar6 = local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[0];
  }
  local_138.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
       (long)(int)uVar6;
  local_138.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
       (long)(int)uVar4;
  local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_data = local_140;
  local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_dims._M_elems[0] = 1;
  local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[1] = 1;
  local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[2] = 1;
  local_138.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)local_174
  ;
  local_40.m_lhs_xpr = &local_168;
  local_40.m_rhs_xpr = &local_138;
  local_138.m_lhs_xpr.m_data = local_168.m_data;
  local_138.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
       local_168.m_dimensions.super_array<long,_3>._M_elems[0];
  local_138.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
       local_168.m_dimensions.super_array<long,_3>._M_elems[1];
  local_138.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
       local_168.m_dimensions.super_array<long,_3>._M_elems[2];
  local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_dims._M_elems[1] = uVar5;
  local_138.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_dims._M_elems[2] = uVar1;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_3UL>,_const_Eigen::TensorReshapingOp<const_std::array<int,_3UL>,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
  ::run(&local_40,local_148->edevice);
  return;
}

Assistant:

void LogSoftmax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  Tensor z(Dim({xs[0]->d.cols()},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  // TODO? Is this broadcast efficient on CPU?
  Eigen::array<int, 1> red_axis; red_axis[0] = 0;
  z.tb<1>().device(*dev.edevice) = dEdf.tb<2>().sum(red_axis);
  Eigen::array<int, 3> bcast = {(int)fx.d.rows(), 1, 1};
  Eigen::array<int, 3> morph = {1, (int)z.d[0], (int)z.d.bd};
  dEdxi.tb<2>().device(*dev.edevice) += fx.tb<2>().exp() * -z.tvec().reshape(morph).broadcast(bcast) + dEdf.tb<2>();
}